

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
* Catch::
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  ::getInternal(void)

{
  _Rb_tree_header *p_Var1;
  ISingleton *in_RAX;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar2;
  
  if (getInternal::s_instance ==
      (Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
       *)0x0) {
    pSVar2 = (Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              *)operator_new(0x150);
    (pSVar2->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub =
         (_func_int **)&PTR__RegistryHub_001834b8;
    (pSVar2->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub =
         (_func_int **)&PTR__RegistryHub_00183538;
    (pSVar2->super_RegistryHub).super_NonCopyable._vptr_NonCopyable =
         (_func_int **)&PTR__RegistryHub_00183590;
    (pSVar2->super_RegistryHub).m_testCaseRegistry.super_ITestCaseRegistry._vptr_ITestCaseRegistry =
         (_func_int **)&PTR__TestRegistry_00182828;
    (pSVar2->super_RegistryHub).m_testCaseRegistry.m_functions.
    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_testCaseRegistry.m_functions.
    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pSVar2->super_RegistryHub).m_testCaseRegistry.m_functions.
             super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(pSVar2->super_RegistryHub).m_testCaseRegistry.m_functions.
             super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 4) = 0;
    (pSVar2->super_RegistryHub).m_testCaseRegistry.m_sortedFunctions.
    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_testCaseRegistry.m_sortedFunctions.
    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_testCaseRegistry.m_sortedFunctions.
    super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_testCaseRegistry.m_unnamedCount = 0;
    std::ios_base::Init::Init(&(pSVar2->super_RegistryHub).m_testCaseRegistry.m_ostreamInit);
    (pSVar2->super_RegistryHub).m_reporterRegistry.super_IReporterRegistry._vptr_IReporterRegistry =
         (_func_int **)&PTR__ReporterRegistry_001814b8;
    p_Var1 = &(pSVar2->super_RegistryHub).m_reporterRegistry.m_factories._M_t._M_impl.
              super__Rb_tree_header;
    (pSVar2->super_RegistryHub).m_reporterRegistry.m_factories._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = _S_red;
    *(_Base_ptr *)
     ((long)&(pSVar2->super_RegistryHub).m_reporterRegistry.m_factories._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
    *(_Rb_tree_header **)
     ((long)&(pSVar2->super_RegistryHub).m_reporterRegistry.m_factories._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) = p_Var1;
    *(_Rb_tree_header **)
     ((long)&(pSVar2->super_RegistryHub).m_reporterRegistry.m_factories._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) = p_Var1;
    (pSVar2->super_RegistryHub).m_reporterRegistry.m_factories._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    (pSVar2->super_RegistryHub).m_reporterRegistry.m_listeners.
    super__Vector_base<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_reporterRegistry.m_listeners.
    super__Vector_base<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_reporterRegistry.m_listeners.
    super__Vector_base<std::shared_ptr<Catch::IReporterFactory>,_std::allocator<std::shared_ptr<Catch::IReporterFactory>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_exceptionTranslatorRegistry.super_IExceptionTranslatorRegistry.
    _vptr_IExceptionTranslatorRegistry = (_func_int **)&PTR__ExceptionTranslatorRegistry_001810e0;
    (pSVar2->super_RegistryHub).m_exceptionTranslatorRegistry.m_translators.
    super__Vector_base<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>,_std::allocator<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_exceptionTranslatorRegistry.m_translators.
    super__Vector_base<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>,_std::allocator<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_exceptionTranslatorRegistry.m_translators.
    super__Vector_base<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>,_std::allocator<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_tagAliasRegistry.super_ITagAliasRegistry._vptr_ITagAliasRegistry =
         (_func_int **)&PTR__TagAliasRegistry_00181718;
    p_Var1 = &(pSVar2->super_RegistryHub).m_tagAliasRegistry.m_registry._M_t._M_impl.
              super__Rb_tree_header;
    (pSVar2->super_RegistryHub).m_tagAliasRegistry.m_registry._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = _S_red;
    *(_Base_ptr *)
     ((long)&(pSVar2->super_RegistryHub).m_tagAliasRegistry.m_registry._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
    *(_Rb_tree_header **)
     ((long)&(pSVar2->super_RegistryHub).m_tagAliasRegistry.m_registry._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) = p_Var1;
    *(_Rb_tree_header **)
     ((long)&(pSVar2->super_RegistryHub).m_tagAliasRegistry.m_registry._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) = p_Var1;
    (pSVar2->super_RegistryHub).m_tagAliasRegistry.m_registry._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = 0;
    (pSVar2->super_RegistryHub).m_exceptionRegistry.m_exceptions.
    super__Vector_base<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_exceptionRegistry.m_exceptions.
    super__Vector_base<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_exceptionRegistry.m_exceptions.
    super__Vector_base<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_enumValuesRegistry.super_IMutableEnumValuesRegistry.
    _vptr_IMutableEnumValuesRegistry = (_func_int **)&PTR__EnumValuesRegistry_001820a0;
    (pSVar2->super_RegistryHub).m_enumValuesRegistry.m_enumInfos.
    super__Vector_base<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_enumValuesRegistry.m_enumInfos.
    super__Vector_base<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pSVar2->super_RegistryHub).m_enumValuesRegistry.m_enumInfos.
    super__Vector_base<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>,_std::allocator<std::unique_ptr<Catch::Detail::EnumInfo,_std::default_delete<Catch::Detail::EnumInfo>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pSVar2->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub =
         (_func_int **)&PTR__Singleton_00183320;
    (pSVar2->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub =
         (_func_int **)&PTR__Singleton_001833a0;
    (pSVar2->super_RegistryHub).super_NonCopyable._vptr_NonCopyable =
         (_func_int **)&PTR__Singleton_001833f8;
    (pSVar2->super_ISingleton)._vptr_ISingleton = (_func_int **)&PTR__Singleton_00183418;
    getInternal::s_instance = pSVar2;
    addSingleton(in_RAX);
  }
  return getInternal::s_instance;
}

Assistant:

static auto getInternal() -> Singleton* {
            static Singleton* s_instance = nullptr;
            if( !s_instance ) {
                s_instance = new Singleton;
                addSingleton( s_instance );
            }
            return s_instance;
        }